

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
     can_feature_be_implemented_without_extensions(Feature feature)

{
  return can_feature_be_implemented_without_extensions::retval[feature];
}

Assistant:

bool CompilerGLSL::ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions(Feature feature)
{
	static const bool retval[FeatureCount] = {
		false, false, false, false, false, false,
		true, // SubgroupBalloFindLSB_MSB
		false, false, false, false,
		true, // SubgroupMemBarrier - replaced with workgroup memory barriers
		false, false, true,  false
	};

	return retval[feature];
}